

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<int> __thiscall
Omega_h::coalesce<int>
          (Omega_h *this,vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays)

{
  int iVar1;
  LO size_in;
  bool bVar2;
  size_type sVar3;
  int *piVar4;
  reference pvVar5;
  reference pvVar6;
  void *pvVar7;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar8;
  Read<int> RVar9;
  Write<int> local_140;
  undefined1 local_130 [8];
  type f;
  undefined1 auStack_100 [4];
  value_type offset;
  value_type array;
  size_t i_1;
  string local_e0 [32];
  undefined1 local_c0 [8];
  Write<int> out;
  ulong uStack_a8;
  value_type out_size;
  size_t i;
  allocator<int> local_89;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> offsets;
  vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays_local;
  ulong local_30;
  ulong local_20;
  
  offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)arrays;
  bVar2 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::empty(arrays);
  if (bVar2) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    pvVar8 = extraout_RDX;
  }
  else {
    sVar3 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::size(arrays);
    std::allocator<int>::allocator(&local_89);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_88,sVar3 + 1,&local_89);
    std::allocator<int>::~allocator(&local_89);
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)local_88);
    if (piVar4 == (int *)0x0) {
      fail("assertion %s failed at %s +%d\n","offsets.data() != nullptr",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
           ,0x1c2);
    }
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_88,0);
    *pvVar5 = 0;
    uStack_a8 = 1;
    while( true ) {
      sVar3 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::size(arrays);
      if (sVar3 < uStack_a8) break;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_88,uStack_a8 - 1);
      iVar1 = *pvVar5;
      pvVar6 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::operator[]
                         (arrays,uStack_a8);
      if (((ulong)(pvVar6->write_).shared_alloc_.alloc & 1) == 0) {
        local_20 = ((pvVar6->write_).shared_alloc_.alloc)->size;
      }
      else {
        local_20 = (ulong)(pvVar6->write_).shared_alloc_.alloc >> 3;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_88,uStack_a8);
      *pvVar5 = iVar1 + (int)(local_20 >> 2);
      uStack_a8 = uStack_a8 + 1;
    }
    sVar3 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::size(arrays);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_88,sVar3);
    size_in = *pvVar5;
    out.shared_alloc_.direct_ptr._4_4_ = size_in;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"",(allocator *)((long)&i_1 + 7));
    Write<int>::Write((Write<int> *)local_c0,size_in,(string *)local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    array.write_.shared_alloc_.direct_ptr = (void *)0x0;
    while( true ) {
      pvVar8 = array.write_.shared_alloc_.direct_ptr;
      pvVar7 = (void *)std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::size
                                 (arrays);
      if (pvVar7 <= pvVar8) break;
      pvVar6 = std::vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_>::operator[]
                         (arrays,(size_type)array.write_.shared_alloc_.direct_ptr);
      Read<int>::Read((Read<int> *)auStack_100,pvVar6);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_88,
                          (size_type)array.write_.shared_alloc_.direct_ptr);
      f.array.write_.shared_alloc_.direct_ptr._4_4_ = *pvVar5;
      Write<int>::Write((Write<int> *)local_130,(Write<int> *)local_c0);
      f.out.shared_alloc_.direct_ptr._0_4_ = f.array.write_.shared_alloc_.direct_ptr._4_4_;
      Read<int>::Read((Read<int> *)&f.offset,(Read<int> *)auStack_100);
      if (((ulong)_auStack_100 & 1) == 0) {
        local_30 = _auStack_100->size;
      }
      else {
        local_30 = (ulong)_auStack_100 >> 3;
      }
      parallel_for<Omega_h::coalesce<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::_lambda(int)_1_>
                ((LO)(local_30 >> 2),(type *)local_130,"coalesce");
      coalesce<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::
      {lambda(int)#1}::~vector((_lambda_int__1_ *)local_130);
      Read<int>::~Read((Read<int> *)auStack_100);
      array.write_.shared_alloc_.direct_ptr =
           (void *)((long)array.write_.shared_alloc_.direct_ptr + 1);
    }
    Write<int>::Write(&local_140,(Write<int> *)local_c0);
    Read<int>::Read((Read<int> *)this,&local_140);
    Write<int>::~Write(&local_140);
    Write<int>::~Write((Write<int> *)local_c0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_88);
    pvVar8 = extraout_RDX_00;
  }
  RVar9.write_.shared_alloc_.direct_ptr = pvVar8;
  RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar9.write_.shared_alloc_;
}

Assistant:

Read<T> coalesce(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  std::vector<LO> offsets(arrays.size() + 1);
  OMEGA_H_CHECK(offsets.data() != nullptr);
  offsets[0] = 0;
  for (std::size_t i = 1; i <= arrays.size(); ++i) {
    offsets[i] = offsets[i - 1] + arrays[i].size();
  }
  auto out_size = offsets[arrays.size()];
  auto out = Write<T>(out_size);
  for (std::size_t i = 0; i < arrays.size(); ++i) {
    auto array = arrays[std::size_t(i)];
    auto offset = offsets[i];
    auto f = OMEGA_H_LAMBDA(LO j) { out[offset + j] = array[j]; };
    parallel_for(array.size(), f, "coalesce");
  }
  return out;
}